

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O1

Vec_Ptr_t * createArenaLi(Aig_Man_t *pAigNew,Vec_Ptr_t *vBarriers,Vec_Ptr_t *vArenaSignal)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  
  if (vBarriers != (Vec_Ptr_t *)0x0) {
    uVar1 = vBarriers->nSize;
    if (0 < (long)(int)uVar1) {
      pVVar4 = (Vec_Ptr_t *)malloc(0x10);
      uVar8 = 8;
      if (8 < uVar1) {
        uVar8 = (ulong)uVar1;
      }
      pVVar4->nSize = 0;
      pVVar4->nCap = (int)uVar8;
      ppvVar5 = (void **)malloc(uVar8 << 3);
      pVVar4->pArray = ppvVar5;
      lVar7 = 0;
      do {
        if (vArenaSignal->nSize <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pAVar6 = Aig_ObjCreateCo(pAigNew,(Aig_Obj_t *)vArenaSignal->pArray[lVar7]);
        uVar2 = pVVar4->nSize;
        uVar3 = pVVar4->nCap;
        if (uVar2 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar3 * 2;
            if (iVar9 <= (int)uVar3) goto LAB_005b13f4;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar3 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar9;
        }
LAB_005b13f4:
        pVVar4->nSize = uVar2 + 1;
        pVVar4->pArray[(int)uVar2] = pAVar6;
        lVar7 = lVar7 + 1;
        if ((int)uVar1 == lVar7) {
          return pVVar4;
        }
      } while( true );
    }
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * createArenaLi( Aig_Man_t *pAigNew, Vec_Ptr_t *vBarriers, Vec_Ptr_t *vArenaSignal )
{
	Vec_Ptr_t *vArenaLi;
	int barrierCount;
	int i;
	Aig_Obj_t *pObj, *pObjDriver;

	if( vBarriers == NULL )
		return NULL;

	barrierCount = Vec_PtrSize(vBarriers);
	if( barrierCount <= 0 )
		return NULL;

	vArenaLi = Vec_PtrAlloc(barrierCount);	
	for( i=0; i<barrierCount; i++ )
	{
		pObjDriver = (Aig_Obj_t *)Vec_PtrEntry( vArenaSignal, i );
		pObj = Aig_ObjCreateCo( pAigNew, pObjDriver );
		Vec_PtrPush( vArenaLi, pObj );
	}

	return vArenaLi;
}